

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O1

void char_callback(GLFWwindow *window,uint codepoint)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  int iVar5;
  double dVar6;
  
  pvVar4 = glfwGetWindowUserPointer(window);
  uVar2 = counter;
  counter = counter + 1;
  uVar1 = *(uint *)((long)pvVar4 + 8);
  dVar6 = glfwGetTime();
  iVar3 = wctomb((char *)&get_character_string_result,codepoint);
  iVar5 = 0;
  if (iVar3 != -1) {
    iVar5 = iVar3;
  }
  *(undefined1 *)((long)&get_character_string_result + (long)iVar5) = 0;
  printf("%08x to %i at %0.3f: Character 0x%08x (%s) input\n",dVar6,(ulong)uVar2,(ulong)uVar1,
         codepoint,&get_character_string_result);
  return;
}

Assistant:

static void char_callback(GLFWwindow* window, unsigned int codepoint)
{
    Slot* slot = glfwGetWindowUserPointer(window);
    printf("%08x to %i at %0.3f: Character 0x%08x (%s) input\n",
           counter++, slot->number, glfwGetTime(), codepoint,
           get_character_string(codepoint));
}